

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

Gia_SimRsbMan_t * Gia_SimRsbAlloc(Gia_Man_t *pGia)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_SimRsbMan_t *pGVar4;
  word *pwVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Vec_Wrd_t *pVVar8;
  size_t __nmemb;
  
  pGVar4 = (Gia_SimRsbMan_t *)calloc(1,0x58);
  pGVar4->pGia = pGia;
  iVar1 = pGia->vSimsPi->nSize;
  iVar3 = pGia->vCis->nSize;
  iVar2 = iVar1 / iVar3;
  pGVar4->nWords = iVar2;
  if (iVar1 % iVar3 != 0) {
    __assert_fail("Vec_WrdSize(pGia->vSimsPi) % Gia_ManCiNum(pGia) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x1d2,"Gia_SimRsbMan_t *Gia_SimRsbAlloc(Gia_Man_t *)");
  }
  __nmemb = (size_t)iVar2;
  pwVar5 = (word *)calloc(__nmemb,8);
  pGVar4->pFunc[0] = pwVar5;
  pwVar5 = (word *)calloc(__nmemb,8);
  pGVar4->pFunc[1] = pwVar5;
  pwVar5 = (word *)calloc(__nmemb,8);
  pGVar4->pFunc[2] = pwVar5;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(4000);
  pVVar6->pArray = piVar7;
  pGVar4->vTfo = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 1000;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(4000);
  pVVar6->pArray = piVar7;
  pGVar4->vCands = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 0x10;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(0x40);
  pVVar6->pArray = piVar7;
  pGVar4->vFanins = pVVar6;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 0x10;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(0x40);
  pVVar6->pArray = piVar7;
  pGVar4->vFanins2 = pVVar6;
  pVVar8 = Gia_ManSimPatSim(pGia);
  pGVar4->vSimsObj = pVVar8;
  iVar1 = pVVar8->nSize;
  pVVar8 = (Vec_Wrd_t *)malloc(0x10);
  iVar3 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar3 = iVar1;
  }
  pVVar8->nCap = iVar3;
  if (iVar3 == 0) {
    pwVar5 = (word *)0x0;
  }
  else {
    pwVar5 = (word *)malloc((long)iVar3 << 3);
  }
  pVVar8->pArray = pwVar5;
  pVVar8->nSize = iVar1;
  memset(pwVar5,0,(long)iVar1 << 3);
  pGVar4->vSimsObj2 = pVVar8;
  if (iVar2 == iVar1 / pGia->nObjs) {
    Gia_ManStaticFanoutStart(pGia);
    return pGVar4;
  }
  __assert_fail("p->nWords == Vec_WrdSize(p->vSimsObj) / Gia_ManObjNum(pGia)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x1dc,"Gia_SimRsbMan_t *Gia_SimRsbAlloc(Gia_Man_t *)");
}

Assistant:

Gia_SimRsbMan_t * Gia_SimRsbAlloc( Gia_Man_t * pGia )
{
    Gia_SimRsbMan_t * p = ABC_CALLOC( Gia_SimRsbMan_t, 1 );
    p->pGia      = pGia;
    p->nWords    = Vec_WrdSize(pGia->vSimsPi) / Gia_ManCiNum(pGia); assert( Vec_WrdSize(pGia->vSimsPi) % Gia_ManCiNum(pGia) == 0 );
    p->pFunc[0]  = ABC_CALLOC( word, p->nWords );
    p->pFunc[1]  = ABC_CALLOC( word, p->nWords );
    p->pFunc[2]  = ABC_CALLOC( word, p->nWords );
    p->vTfo      = Vec_IntAlloc( 1000 );
    p->vCands    = Vec_IntAlloc( 1000 );
    p->vFanins   = Vec_IntAlloc( 10 );
    p->vFanins2  = Vec_IntAlloc( 10 );
    p->vSimsObj  = Gia_ManSimPatSim( pGia );
    p->vSimsObj2 = Vec_WrdStart( Vec_WrdSize(p->vSimsObj) );
    assert( p->nWords == Vec_WrdSize(p->vSimsObj) / Gia_ManObjNum(pGia) );
    Gia_ManStaticFanoutStart( pGia );
    return p;
}